

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::AbortingErrorCollector::RecordError
          (AbortingErrorCollector *this,string_view filename,string_view element_name,
          Message *message,ErrorLocation location,string_view error_message)

{
  LogMessage *pLVar1;
  string_view str;
  string_view str_00;
  string_view str_01;
  LogMessage LStack_38;
  
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,0x36be);
  str._M_str = "AddError() called unexpectedly: ";
  str._M_len = 0x20;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_38,str);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,filename);
  str_00._M_str = " [";
  str_00._M_len = 2;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar1,str_00);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,element_name);
  str_01._M_str = "]: ";
  str_01._M_len = 3;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar1,str_01);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,error_message);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

void RecordError(absl::string_view filename, absl::string_view element_name,
                   const Message* message, ErrorLocation location,
                   absl::string_view error_message) override {
    ABSL_LOG(FATAL) << "AddError() called unexpectedly: " << filename << " ["
                    << element_name << "]: " << error_message;
  }